

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyFast6.c
# Opt level: O2

word Extra_Truth6MinimumRoundMany(word t,int *pStore,char *pCanonPerm,uint *pCanonPhase)

{
  int iVar1;
  int iVar2;
  word wVar3;
  long lVar4;
  long lVar5;
  
  do {
    wVar3 = t;
    t = wVar3;
    lVar4 = 0;
    iVar1 = *pStore;
    while (iVar2 = iVar1, lVar5 = lVar4, lVar4 = lVar5 + 1, lVar4 != 6) {
      iVar1 = pStore[lVar4];
      if (iVar2 == pStore[lVar4]) {
        t = Extra_Truth6MinimumRoundOne(t,(int)lVar5,pCanonPerm,pCanonPhase);
        iVar1 = iVar2;
      }
    }
  } while (wVar3 != t);
  return wVar3;
}

Assistant:

word Extra_Truth6MinimumRoundMany( word t, int* pStore, char* pCanonPerm, unsigned* pCanonPhase )
{
    int i, bitInfoTemp;
    word tMin0, tMin=t;
    do
    {
        bitInfoTemp = pStore[0];
        tMin0 = tMin;
        for ( i = 0; i < 5; i++ )
        {
            if(bitInfoTemp == pStore[i+1])          
                tMin = Extra_Truth6MinimumRoundOne( tMin, i, pCanonPerm, pCanonPhase );         
            else
                bitInfoTemp = pStore[i+1];
        }
    }while ( tMin0 != tMin );
    return tMin;
}